

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsRanging.cpp
# Opt level: O3

void writeRangingFile(FILE *file,HighsLp *lp,double objective_function_value,HighsBasis *basis,
                     HighsSolution *solution,HighsRanging *ranging,HighsInt style)

{
  pointer pbVar1;
  long lVar2;
  ulong uVar3;
  size_t sVar4;
  char *pcVar5;
  long lVar6;
  string name;
  array<char,_32UL> up_value;
  array<char,_32UL> dn_value;
  array<char,_32UL> up_objective;
  array<char,_32UL> dn_objective;
  array<char,_32UL> objective;
  stringstream ss;
  undefined1 *local_2d8;
  undefined8 local_2d0;
  undefined1 local_2c8 [16];
  string local_2b8;
  HighsBasis *local_298;
  HighsSolution *local_290;
  pointer local_288;
  pointer local_280;
  undefined4 local_278;
  undefined4 uStack_274;
  undefined4 uStack_270;
  undefined4 uStack_26c;
  undefined4 local_268;
  undefined4 uStack_264;
  undefined4 uStack_260;
  undefined4 uStack_25c;
  undefined1 local_258 [32];
  undefined1 local_238 [32];
  undefined1 local_218 [40];
  double local_1f0;
  pointer local_1e8;
  pointer local_1e0;
  array<char,_32UL> local_1d8;
  stringstream local_1b8 [16];
  undefined1 local_1a8 [112];
  ios_base local_138 [264];
  
  local_298 = basis;
  local_290 = solution;
  if (ranging->valid != false) {
    local_1f0 = objective_function_value;
    fwrite("Valid\n",6,1,(FILE *)file);
    std::__cxx11::stringstream::stringstream(local_1b8);
    local_280 = (lp->col_names_).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
    local_288 = (lp->col_names_).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    local_1e0 = (lp->row_names_).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    local_1e8 = (lp->row_names_).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
    highsDoubleToString(&local_1d8,local_1f0,1e-13);
    fprintf((FILE *)file,"Objective %s\n",&local_1d8);
    if (style == 1) {
      pcVar5 = 
      "\n                                            Cost ranging\nColumn Status  DownObj    Down                  Value                 Up         UpObj      Name\n"
      ;
      sVar4 = 0x9b;
    }
    else {
      pcVar5 = "\n# Cost ranging\n";
      sVar4 = 0x10;
    }
    fwrite(pcVar5,sVar4,1,(FILE *)file);
    if (0 < lp->num_col_) {
      lVar6 = 8;
      uVar3 = 0;
      do {
        local_2d0 = 0;
        local_2c8[0] = 0;
        local_2d8 = local_2c8;
        std::__cxx11::stringbuf::str((string *)(local_1a8 + 8));
        if (local_2d8 != local_2c8) {
          operator_delete(local_2d8);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"C",1);
        std::ostream::operator<<((ostream *)local_1a8,(int)uVar3);
        if (local_288 == local_280) {
          std::__cxx11::stringbuf::str();
        }
        else {
          pbVar1 = (lp->col_names_).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          lVar2 = *(long *)((long)pbVar1 + lVar6 + -8);
          local_2d8 = local_2c8;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_2d8,lVar2,
                     *(long *)((long)&(pbVar1->_M_dataplus)._M_p + lVar6) + lVar2);
        }
        if (style == 1) {
          statusToString_abi_cxx11_
                    (&local_2b8,
                     (local_298->col_status).
                     super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>._M_impl
                     .super__Vector_impl_data._M_start[uVar3],
                     (lp->col_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar3],
                     (lp->col_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar3]);
          fprintf((FILE *)file,
                  "%6d   %4s  %-10.4g %-10.4g            %-10.4g            %-10.4g %-10.4g %-s\n",
                  SUB84((ranging->col_cost_dn).objective_.
                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start[uVar3],0),
                  SUB84((ranging->col_cost_dn).value_.
                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start[uVar3],0),
                  (lp->col_cost_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar3],
                  (ranging->col_cost_up).value_.super__Vector_base<double,_std::allocator<double>_>.
                  _M_impl.super__Vector_impl_data._M_start[uVar3],
                  (ranging->col_cost_up).objective_.
                  super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar3],uVar3 & 0xffffffff,
                  CONCAT44(local_2b8._M_dataplus._M_p._4_4_,local_2b8._M_dataplus._M_p._0_4_),
                  local_2d8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT44(local_2b8._M_dataplus._M_p._4_4_,local_2b8._M_dataplus._M_p._0_4_) !=
              &local_2b8.field_2) {
            operator_delete((undefined1 *)
                            CONCAT44(local_2b8._M_dataplus._M_p._4_4_,
                                     local_2b8._M_dataplus._M_p._0_4_));
          }
        }
        else {
          highsDoubleToString((array<char,_32UL> *)&local_2b8,
                              (ranging->col_cost_dn).objective_.
                              super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start[uVar3],1e-13);
          highsDoubleToString((array<char,_32UL> *)&local_2b8,
                              (ranging->col_cost_up).objective_.
                              super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start[uVar3],1e-13);
          highsDoubleToString((array<char,_32UL> *)&local_2b8,
                              (ranging->col_cost_dn).value_.
                              super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start[uVar3],1e-13);
          highsDoubleToString((array<char,_32UL> *)&local_2b8,
                              (ranging->col_cost_up).value_.
                              super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start[uVar3],1e-13);
          local_268 = local_2b8.field_2._M_allocated_capacity._0_4_;
          uStack_264 = local_2b8.field_2._M_allocated_capacity._4_4_;
          uStack_260 = local_2b8.field_2._8_4_;
          uStack_25c = local_2b8.field_2._12_4_;
          local_278 = local_2b8._M_dataplus._M_p._0_4_;
          uStack_274 = local_2b8._M_dataplus._M_p._4_4_;
          uStack_270 = (undefined4)local_2b8._M_string_length;
          uStack_26c = local_2b8._M_string_length._4_4_;
          fprintf((FILE *)file,"%-s %s %s %s %s\n",local_2d8,local_218,local_258,&local_278,
                  local_238);
        }
        if (local_2d8 != local_2c8) {
          operator_delete(local_2d8);
        }
        uVar3 = uVar3 + 1;
        lVar6 = lVar6 + 0x20;
      } while ((long)uVar3 < (long)lp->num_col_);
    }
    if (style == 1) {
      pcVar5 = 
      "\n                                            Bound ranging\nColumn Status  DownObj    Down       Lower      Value      Upper      Up         UpObj      Name\n"
      ;
      sVar4 = 0x9c;
    }
    else {
      pcVar5 = "\n# Bound ranging\n# Columns\n";
      sVar4 = 0x1b;
    }
    fwrite(pcVar5,sVar4,1,(FILE *)file);
    if (0 < lp->num_col_) {
      lVar6 = 8;
      uVar3 = 0;
      do {
        local_2d0 = 0;
        local_2c8[0] = 0;
        local_2d8 = local_2c8;
        std::__cxx11::stringbuf::str((string *)(local_1a8 + 8));
        if (local_2d8 != local_2c8) {
          operator_delete(local_2d8);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"C",1);
        std::ostream::operator<<((ostream *)local_1a8,(int)uVar3);
        if (local_288 == local_280) {
          std::__cxx11::stringbuf::str();
        }
        else {
          pbVar1 = (lp->col_names_).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          lVar2 = *(long *)((long)pbVar1 + lVar6 + -8);
          local_2d8 = local_2c8;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_2d8,lVar2,
                     *(long *)((long)&(pbVar1->_M_dataplus)._M_p + lVar6) + lVar2);
        }
        if (style == 1) {
          statusToString_abi_cxx11_
                    (&local_2b8,
                     (local_298->col_status).
                     super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>._M_impl
                     .super__Vector_impl_data._M_start[uVar3],
                     (lp->col_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar3],
                     (lp->col_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar3]);
          fprintf((FILE *)file,
                  "%6d   %4s  %-10.4g %-10.4g %-10.4g %-10.4g %-10.4g %-10.4g %-10.4g %-s\n",
                  SUB84((ranging->col_bound_dn).objective_.
                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start[uVar3],0),
                  SUB84((ranging->col_bound_dn).value_.
                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start[uVar3],0),
                  (lp->col_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar3],
                  (local_290->col_value).super__Vector_base<double,_std::allocator<double>_>._M_impl
                  .super__Vector_impl_data._M_start[uVar3],
                  (lp->col_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar3],
                  (ranging->col_bound_up).value_.super__Vector_base<double,_std::allocator<double>_>
                  ._M_impl.super__Vector_impl_data._M_start[uVar3],
                  (ranging->col_bound_up).objective_.
                  super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar3],uVar3 & 0xffffffff,
                  CONCAT44(local_2b8._M_dataplus._M_p._4_4_,local_2b8._M_dataplus._M_p._0_4_),
                  local_2d8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT44(local_2b8._M_dataplus._M_p._4_4_,local_2b8._M_dataplus._M_p._0_4_) !=
              &local_2b8.field_2) {
            operator_delete((undefined1 *)
                            CONCAT44(local_2b8._M_dataplus._M_p._4_4_,
                                     local_2b8._M_dataplus._M_p._0_4_));
          }
        }
        else {
          highsDoubleToString((array<char,_32UL> *)&local_2b8,
                              (ranging->col_bound_dn).objective_.
                              super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start[uVar3],1e-13);
          highsDoubleToString((array<char,_32UL> *)&local_2b8,
                              (ranging->col_bound_up).objective_.
                              super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start[uVar3],1e-13);
          highsDoubleToString((array<char,_32UL> *)&local_2b8,
                              (ranging->col_bound_dn).value_.
                              super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start[uVar3],1e-13);
          highsDoubleToString((array<char,_32UL> *)&local_2b8,
                              (ranging->col_bound_up).value_.
                              super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start[uVar3],1e-13);
          local_268 = local_2b8.field_2._M_allocated_capacity._0_4_;
          uStack_264 = local_2b8.field_2._M_allocated_capacity._4_4_;
          uStack_260 = local_2b8.field_2._8_4_;
          uStack_25c = local_2b8.field_2._12_4_;
          local_278 = local_2b8._M_dataplus._M_p._0_4_;
          uStack_274 = local_2b8._M_dataplus._M_p._4_4_;
          uStack_270 = (undefined4)local_2b8._M_string_length;
          uStack_26c = local_2b8._M_string_length._4_4_;
          fprintf((FILE *)file,"%-s %s %s %s %s\n",local_2d8,local_218,local_258,&local_278,
                  local_238);
        }
        if (local_2d8 != local_2c8) {
          operator_delete(local_2d8);
        }
        uVar3 = uVar3 + 1;
        lVar6 = lVar6 + 0x20;
      } while ((long)uVar3 < (long)lp->num_col_);
    }
    if (style == 1) {
      pcVar5 = 
      "                                            Bound ranging\n   Row Status  DownObj    Down       Lower      Value      Upper      Up         UpObj      Name\n"
      ;
      sVar4 = 0x9b;
    }
    else {
      pcVar5 = "# Rows\n";
      sVar4 = 7;
    }
    fwrite(pcVar5,sVar4,1,(FILE *)file);
    if (0 < lp->num_row_) {
      lVar6 = 8;
      uVar3 = 0;
      do {
        local_2d0 = 0;
        local_2c8[0] = 0;
        local_2d8 = local_2c8;
        std::__cxx11::stringbuf::str((string *)(local_1a8 + 8));
        if (local_2d8 != local_2c8) {
          operator_delete(local_2d8);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"R",1);
        std::ostream::operator<<((ostream *)local_1a8,(int)uVar3);
        if (local_1e0 == local_1e8) {
          std::__cxx11::stringbuf::str();
        }
        else {
          pbVar1 = (lp->row_names_).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          lVar2 = *(long *)((long)pbVar1 + lVar6 + -8);
          local_2d8 = local_2c8;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_2d8,lVar2,
                     *(long *)((long)&(pbVar1->_M_dataplus)._M_p + lVar6) + lVar2);
        }
        if (style == 1) {
          statusToString_abi_cxx11_
                    (&local_2b8,
                     (local_298->row_status).
                     super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>._M_impl
                     .super__Vector_impl_data._M_start[uVar3],
                     (lp->row_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar3],
                     (lp->row_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar3]);
          fprintf((FILE *)file,
                  "%6d   %4s  %-10.4g %-10.4g %-10.4g %-10.4g %-10.4g %-10.4g %-10.4g %-s\n",
                  SUB84((ranging->row_bound_dn).objective_.
                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start[uVar3],0),
                  SUB84((ranging->row_bound_dn).value_.
                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start[uVar3],0),
                  (lp->row_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar3],
                  (local_290->row_value).super__Vector_base<double,_std::allocator<double>_>._M_impl
                  .super__Vector_impl_data._M_start[uVar3],
                  (lp->row_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar3],
                  (ranging->row_bound_up).value_.super__Vector_base<double,_std::allocator<double>_>
                  ._M_impl.super__Vector_impl_data._M_start[uVar3],
                  (ranging->row_bound_up).objective_.
                  super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar3],uVar3 & 0xffffffff,
                  CONCAT44(local_2b8._M_dataplus._M_p._4_4_,local_2b8._M_dataplus._M_p._0_4_),
                  local_2d8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT44(local_2b8._M_dataplus._M_p._4_4_,local_2b8._M_dataplus._M_p._0_4_) !=
              &local_2b8.field_2) {
            operator_delete((undefined1 *)
                            CONCAT44(local_2b8._M_dataplus._M_p._4_4_,
                                     local_2b8._M_dataplus._M_p._0_4_));
          }
        }
        else {
          highsDoubleToString((array<char,_32UL> *)&local_2b8,
                              (ranging->row_bound_dn).objective_.
                              super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start[uVar3],1e-13);
          highsDoubleToString((array<char,_32UL> *)&local_2b8,
                              (ranging->row_bound_up).objective_.
                              super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start[uVar3],1e-13);
          highsDoubleToString((array<char,_32UL> *)&local_2b8,
                              (ranging->row_bound_dn).value_.
                              super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start[uVar3],1e-13);
          highsDoubleToString((array<char,_32UL> *)&local_2b8,
                              (ranging->row_bound_up).value_.
                              super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start[uVar3],1e-13);
          local_268 = local_2b8.field_2._M_allocated_capacity._0_4_;
          uStack_264 = local_2b8.field_2._M_allocated_capacity._4_4_;
          uStack_260 = local_2b8.field_2._8_4_;
          uStack_25c = local_2b8.field_2._12_4_;
          local_278 = local_2b8._M_dataplus._M_p._0_4_;
          uStack_274 = local_2b8._M_dataplus._M_p._4_4_;
          uStack_270 = (undefined4)local_2b8._M_string_length;
          uStack_26c = local_2b8._M_string_length._4_4_;
          fprintf((FILE *)file,"%-s %s %s %s %s\n",local_2d8,local_218,local_258,&local_278,
                  local_238);
        }
        if (local_2d8 != local_2c8) {
          operator_delete(local_2d8);
        }
        uVar3 = uVar3 + 1;
        lVar6 = lVar6 + 0x20;
      } while ((long)uVar3 < (long)lp->num_row_);
    }
    std::__cxx11::stringstream::~stringstream(local_1b8);
    std::ios_base::~ios_base(local_138);
    return;
  }
  fwrite("None\n",5,1,(FILE *)file);
  return;
}

Assistant:

void writeRangingFile(FILE* file, const HighsLp& lp,
                      const double objective_function_value,
                      const HighsBasis& basis, const HighsSolution& solution,
                      const HighsRanging& ranging, const HighsInt style) {
  if (!ranging.valid) {
    fprintf(file, "None\n");
    return;
  }
  fprintf(file, "Valid\n");
  std::stringstream ss;
  const bool have_col_names = lp.col_names_.size() > 0;
  const bool have_row_names = lp.row_names_.size() > 0;
  const bool pretty = style == kSolutionStylePretty;
  const char* pretty_cost_format =
      "%6d   %4s  %-10.4g %-10.4g            %-10.4g            %-10.4g "
      "%-10.4g %-s\n";
  const char* raw_cost_format = "%-s %s %s %s %s\n";

  const char* pretty_bound_format =
      "%6d   %4s  %-10.4g %-10.4g %-10.4g %-10.4g %-10.4g %-10.4g %-10.4g "
      "%-s\n";
  const char* raw_bound_format = "%-s %s %s %s %s\n";

  std::array<char, 32> dn_objective;
  std::array<char, 32> up_objective;
  std::array<char, 32> dn_value;
  std::array<char, 32> up_value;

  auto objective = highsDoubleToString(objective_function_value,
                                       kRangingValueToStringTolerance);
  fprintf(file, "Objective %s\n", objective.data());
  if (pretty) {
    fprintf(file,
            "\n                                            Cost ranging\n"
            "Column Status  DownObj    Down                  Value             "
            "    Up         UpObj      Name\n");
  } else {
    fprintf(file, "\n# Cost ranging\n");
  }
  for (HighsInt iCol = 0; iCol < lp.num_col_; iCol++) {
    // Create a column name
    ss.str(std::string());
    ss << "C" << iCol;
    const std::string name = have_col_names ? lp.col_names_[iCol] : ss.str();
    if (pretty) {
      fprintf(file, pretty_cost_format, (int)iCol,
              statusToString(basis.col_status[iCol], lp.col_lower_[iCol],
                             lp.col_upper_[iCol])
                  .c_str(),
              ranging.col_cost_dn.objective_[iCol],
              ranging.col_cost_dn.value_[iCol], lp.col_cost_[iCol],
              ranging.col_cost_up.value_[iCol],
              ranging.col_cost_up.objective_[iCol], name.c_str());
    } else {
      dn_objective = highsDoubleToString(ranging.col_cost_dn.objective_[iCol],
                                         kRangingValueToStringTolerance);
      up_objective = highsDoubleToString(ranging.col_cost_up.objective_[iCol],
                                         kRangingValueToStringTolerance);
      dn_value = highsDoubleToString(ranging.col_cost_dn.value_[iCol],
                                     kRangingValueToStringTolerance);
      up_value = highsDoubleToString(ranging.col_cost_up.value_[iCol],
                                     kRangingValueToStringTolerance);
      fprintf(file, raw_cost_format, name.c_str(), dn_objective.data(),
              dn_value.data(), up_value.data(), up_objective.data());
    }
  }
  if (pretty) {
    fprintf(file,
            "\n                                            Bound ranging\n"
            "Column Status  DownObj    Down       Lower      Value      Upper "
            "     Up         UpObj      Name\n");
  } else {
    fprintf(file, "\n# Bound ranging\n# Columns\n");
  }
  for (HighsInt iCol = 0; iCol < lp.num_col_; iCol++) {
    // Create a column name
    ss.str(std::string());
    ss << "C" << iCol;
    const std::string name = have_col_names ? lp.col_names_[iCol] : ss.str();
    if (pretty) {
      fprintf(file, pretty_bound_format, (int)iCol,
              statusToString(basis.col_status[iCol], lp.col_lower_[iCol],
                             lp.col_upper_[iCol])
                  .c_str(),
              ranging.col_bound_dn.objective_[iCol],
              ranging.col_bound_dn.value_[iCol], lp.col_lower_[iCol],
              solution.col_value[iCol], lp.col_upper_[iCol],
              ranging.col_bound_up.value_[iCol],
              ranging.col_bound_up.objective_[iCol], name.c_str());
    } else {
      dn_objective = highsDoubleToString(ranging.col_bound_dn.objective_[iCol],
                                         kRangingValueToStringTolerance);
      up_objective = highsDoubleToString(ranging.col_bound_up.objective_[iCol],
                                         kRangingValueToStringTolerance);
      dn_value = highsDoubleToString(ranging.col_bound_dn.value_[iCol],
                                     kRangingValueToStringTolerance);
      up_value = highsDoubleToString(ranging.col_bound_up.value_[iCol],
                                     kRangingValueToStringTolerance);
      fprintf(file, raw_bound_format, name.c_str(), dn_objective.data(),
              dn_value.data(), up_value.data(), up_objective.data());
    }
  }

  if (pretty) {
    fprintf(file,
            "                                            Bound ranging\n"
            "   Row Status  DownObj    Down       Lower      Value      Upper "
            "     Up         UpObj      Name\n");
  } else {
    fprintf(file, "# Rows\n");
  }
  for (HighsInt iRow = 0; iRow < lp.num_row_; iRow++) {
    // Create a row name
    ss.str(std::string());
    ss << "R" << iRow;
    const std::string name = have_row_names ? lp.row_names_[iRow] : ss.str();
    if (pretty) {
      fprintf(file, pretty_bound_format, (int)iRow,
              statusToString(basis.row_status[iRow], lp.row_lower_[iRow],
                             lp.row_upper_[iRow])
                  .c_str(),
              ranging.row_bound_dn.objective_[iRow],
              ranging.row_bound_dn.value_[iRow], lp.row_lower_[iRow],
              solution.row_value[iRow], lp.row_upper_[iRow],
              ranging.row_bound_up.value_[iRow],
              ranging.row_bound_up.objective_[iRow], name.c_str());
    } else {
      dn_objective = highsDoubleToString(ranging.row_bound_dn.objective_[iRow],
                                         kRangingValueToStringTolerance);
      up_objective = highsDoubleToString(ranging.row_bound_up.objective_[iRow],
                                         kRangingValueToStringTolerance);
      dn_value = highsDoubleToString(ranging.row_bound_dn.value_[iRow],
                                     kRangingValueToStringTolerance);
      up_value = highsDoubleToString(ranging.row_bound_up.value_[iRow],
                                     kRangingValueToStringTolerance);
      fprintf(file, raw_bound_format, name.c_str(), dn_objective.data(),
              dn_value.data(), up_value.data(), up_objective.data());
    }
  }
}